

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLog>
               (GetterYs<unsigned_char> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  undefined1 local_70 [8];
  TransformerLinLog *local_68;
  int local_60;
  ImU32 local_5c;
  float local_58;
  ImVec2 local_54;
  double local_48;
  double dStack_40;
  
  pIVar8 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_60 = iVar10 + -1;
    dVar6 = getter->X0;
    dVar7 = getter->XScale;
    local_70 = (undefined1  [8])getter;
    local_68 = transformer;
    local_5c = col;
    local_58 = line_weight;
    dVar5 = log10((double)getter->Ys
                          [(long)((getter->Offset % iVar10 + iVar10) % iVar10) *
                           (long)getter->Stride] / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar8->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar10].Range.Min;
    IVar3 = pIVar8->PixelRange[iVar10].Min;
    local_54.y = (float)(pIVar8->My[iVar10] *
                         ((dVar2 + (double)(float)(dVar5 / pIVar8->LogDenY[iVar10]) *
                                   (pIVar4->YAxis[iVar10].Range.Max - dVar2)) - dVar2) +
                        (double)IVar3.y);
    local_54.x = (float)(pIVar8->Mx * ((dVar6 + dVar7 * 0.0) - (pIVar4->XAxis).Range.Min) +
                        (double)IVar3.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLog>>
              ((LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog> *)
               local_70,DrawList,&pIVar4->PlotRect);
  }
  else {
    dVar6 = getter->X0;
    dVar7 = getter->XScale;
    iVar10 = getter->Count;
    dVar5 = log10((double)getter->Ys
                          [(long)((getter->Offset % iVar10 + iVar10) % iVar10) *
                           (long)getter->Stride] / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar8->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar10].Range.Min;
    IVar3 = pIVar8->PixelRange[iVar10].Min;
    local_70._4_4_ =
         (float)(pIVar8->My[iVar10] *
                 ((dVar2 + (double)(float)(dVar5 / pIVar8->LogDenY[iVar10]) *
                           (pIVar4->YAxis[iVar10].Range.Max - dVar2)) - dVar2) + (double)IVar3.y);
    local_70._0_4_ =
         (float)(pIVar8->Mx * ((dVar6 + dVar7 * 0.0) - (pIVar4->XAxis).Range.Min) + (double)IVar3.x)
    ;
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar9 = GImPlot;
        dVar6 = getter->X0;
        local_48 = getter->XScale;
        dStack_40 = getter->X0;
        dVar5 = log10((double)getter->Ys
                              [(long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                               (long)getter->Stride] /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        iVar10 = transformer->YAxis;
        pIVar4 = pIVar9->CurrentPlot;
        dVar2 = pIVar4->YAxis[iVar10].Range.Min;
        IVar3 = pIVar9->PixelRange[iVar10].Min;
        fVar12 = (float)(pIVar9->Mx *
                         ((dVar6 + (double)iVar11 * local_48) - (pIVar4->XAxis).Range.Min) +
                        (double)IVar3.x);
        fVar13 = (float)(pIVar9->My[iVar10] *
                         ((dVar2 + (double)(float)(dVar5 / pIVar9->LogDenY[iVar10]) *
                                   (pIVar4->YAxis[iVar10].Range.Max - dVar2)) - dVar2) +
                        (double)IVar3.y);
        local_78.y = fVar13;
        local_78.x = fVar12;
        pIVar4 = pIVar8->CurrentPlot;
        fVar14 = (float)local_70._4_4_;
        if (fVar13 <= (float)local_70._4_4_) {
          fVar14 = fVar13;
        }
        if ((fVar14 < (pIVar4->PlotRect).Max.y) &&
           (fVar14 = (float)(~-(uint)(fVar13 <= (float)local_70._4_4_) & (uint)fVar13 |
                            local_70._4_4_ & -(uint)(fVar13 <= (float)local_70._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
          fVar14 = (float)local_70._0_4_;
          if (fVar12 <= (float)local_70._0_4_) {
            fVar14 = fVar12;
          }
          if ((fVar14 < (pIVar4->PlotRect).Max.x) &&
             (fVar14 = (float)(-(uint)(fVar12 <= (float)local_70._0_4_) & local_70._0_4_ |
                              ~-(uint)(fVar12 <= (float)local_70._0_4_) & (uint)fVar12),
             (pIVar4->PlotRect).Min.x <= fVar14 && fVar14 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_70,&local_78,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_70 = (undefined1  [8])local_78;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}